

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcPointOnCurve::IfcPointOnCurve(IfcPointOnCurve *this)

{
  *(undefined ***)&this->field_0x50 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x58 = 0;
  *(char **)&this->field_0x60 = "IfcPointOnCurve";
  IfcPoint::IfcPoint(&this->super_IfcPoint,&PTR_construction_vtable_24__0080d880);
  *(undefined8 *)&(this->super_IfcPoint).field_0x38 = 0;
  *(undefined8 *)&(this->super_IfcPoint).field_0x40 = 0;
  (this->super_IfcPoint).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x80d7c8;
  *(undefined8 *)&this->field_0x50 = 0x80d868;
  *(undefined8 *)
   &(this->super_IfcPoint).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x80d7f0;
  *(undefined8 *)
   &(this->super_IfcPoint).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x80d818;
  *(undefined8 *)&(this->super_IfcPoint).super_IfcGeometricRepresentationItem.field_0x30 = 0x80d840;
  return;
}

Assistant:

IfcPointOnCurve() : Object("IfcPointOnCurve") {}